

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  undefined1 local_70 [71];
  byte local_29;
  char *pcStack_28;
  bool forward;
  char *op_local;
  uint32_t local_18;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pcStack_28 = op;
  op_local._4_4_ = op0;
  local_18 = result_id;
  op0_local = result_type;
  _result_id_local = this;
  local_29 = should_forward(this,op0);
  result_type_00 = op0_local;
  result_id_00 = local_18;
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_70,(uint32_t)this,SUB41(op_local._4_4_,0))
  ;
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            ((spirv_cross *)(local_70 + 0x20),&stack0xffffffffffffffd8,(char (*) [2])0x5cba12,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             (char (*) [2])0x5b48c4);
  emit_op(this,result_type_00,result_id_00,(string *)(local_70 + 0x20),(bool)(local_29 & 1),false);
  ::std::__cxx11::string::~string((string *)(local_70 + 0x20));
  ::std::__cxx11::string::~string((string *)local_70);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,op_local._4_4_);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(op, "(", to_unpacked_expression(op0), ")"), forward);
	inherit_expression_dependencies(result_id, op0);
}